

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O0

void __thiscall
MeshDenoisingBase::getFaceNeighbor
          (MeshDenoisingBase *this,TriMesh *mesh,FaceHandle fh,FaceNeighborType face_neighbor_type,
          vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *face_neighbor)

{
  int *this_00;
  undefined8 uVar1;
  bool bVar2;
  BaseHandle *this_01;
  reference piVar3;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar4;
  FaceHandle local_144;
  _Self local_140;
  _Self local_138;
  iterator iter;
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
  local_118;
  _Base_ptr local_100;
  undefined1 local_f8;
  int local_ec;
  BaseHandle local_e8;
  BaseHandle local_e4;
  undefined1 local_e0 [8];
  VertexFaceIter vf_it;
  undefined1 local_b0 [8];
  FaceVertexIter fv_it;
  set<int,_std::less<int>,_std::allocator<int>_> neighbor_face_index;
  BaseHandle local_50;
  int local_4c;
  undefined1 local_48 [8];
  FaceFaceIter ff_it;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *face_neighbor_local;
  FaceNeighborType face_neighbor_type_local;
  TriMesh *mesh_local;
  MeshDenoisingBase *this_local;
  FaceHandle fh_local;
  
  ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ = face_neighbor;
  this_local._4_4_ = fh.super_BaseHandle.idx_;
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::clear(face_neighbor);
  if (face_neighbor_type == kEdgeBased) {
    local_4c = this_local._4_4_;
    OpenMesh::PolyConnectivity::ff_iter
              ((FaceFaceIter *)local_48,(PolyConnectivity *)mesh,(FaceHandle)this_local._4_4_);
    while (bVar2 = OpenMesh::Iterators::
                   GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                   ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                               *)local_48),
          uVar1 = ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_, bVar2) {
      local_50.idx_ =
           (int)OpenMesh::Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                             *)local_48);
      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
                ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)uVar1,
                 (value_type *)&local_50);
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                    *)&neighbor_face_index._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                    *)local_48,0);
    }
  }
  else if (face_neighbor_type == kVertexBased) {
    this_00 = &fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
    std::set<int,_std::less<int>,_std::allocator<int>_>::clear
              ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
    OpenMesh::PolyConnectivity::fv_begin
              ((FaceVertexIter *)local_b0,(PolyConnectivity *)mesh,(FaceHandle)this_local._4_4_);
    while (bVar2 = OpenMesh::Iterators::
                   GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                   ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                               *)local_b0), bVar2) {
      local_e4.idx_ =
           (int)OpenMesh::Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                             *)local_b0);
      OpenMesh::PolyConnectivity::vf_iter
                ((VertexFaceIter *)local_e0,(PolyConnectivity *)mesh,(VertexHandle)local_e4.idx_);
      while (bVar2 = OpenMesh::Iterators::
                     GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                     ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                                 *)local_e0), bVar2) {
        local_e8.idx_ =
             (int)OpenMesh::Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                  ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                               *)local_e0);
        bVar2 = OpenMesh::BaseHandle::operator!=(&local_e8,(BaseHandle *)((long)&this_local + 4));
        if (bVar2) {
          this_01 = &OpenMesh::Iterators::
                     GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                     ::operator->((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                                   *)local_e0)->super_BaseHandle;
          local_ec = OpenMesh::BaseHandle::idx(this_01);
          pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             &fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.
                              lap_counter_,&local_ec);
          local_100 = (_Base_ptr)pVar4.first._M_node;
          local_f8 = pVar4.second;
        }
        OpenMesh::Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
        ::operator++(&local_118,
                     (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                      *)local_e0,0);
      }
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    *)&iter,(GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                             *)local_b0,0);
    }
    local_138._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    &fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
    while( true ) {
      local_140._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      &fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
      bVar2 = std::operator!=(&local_138,&local_140);
      uVar1 = ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_;
      if (!bVar2) break;
      piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&local_138);
      OpenMesh::FaceHandle::FaceHandle(&local_144,*piVar3);
      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
                ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)uVar1,
                 &local_144);
      std::_Rb_tree_const_iterator<int>::operator++(&local_138);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
  }
  return;
}

Assistant:

void MeshDenoisingBase::getFaceNeighbor(TriMesh &mesh, TriMesh::FaceHandle fh, FaceNeighborType face_neighbor_type, std::vector<TriMesh::FaceHandle> &face_neighbor)
{
    face_neighbor.clear();
    if(face_neighbor_type == kEdgeBased)
    {
        for(TriMesh::FaceFaceIter ff_it = mesh.ff_iter(fh); ff_it.is_valid(); ff_it++)
            face_neighbor.push_back(*ff_it);
    }
    else if(face_neighbor_type == kVertexBased)
    {
        std::set<int> neighbor_face_index; neighbor_face_index.clear();

        for(TriMesh::FaceVertexIter fv_it = mesh.fv_begin(fh); fv_it.is_valid(); fv_it++)
        {
            for(TriMesh::VertexFaceIter vf_it = mesh.vf_iter(*fv_it); vf_it.is_valid(); vf_it++)
            {
                if((*vf_it) != fh)
                    neighbor_face_index.insert(vf_it->idx());
            }
        }

        for(std::set<int>::iterator iter = neighbor_face_index.begin(); iter != neighbor_face_index.end(); ++ iter)
        {
            face_neighbor.push_back(TriMesh::FaceHandle(*iter));
        }
    }
}